

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::StringMakerBase<true>::convert<bsim::static_quad_value_bit_vector<41>>
          (string *__return_storage_ptr__,StringMakerBase<true> *this,
          static_quad_value_bit_vector<41> *_value)

{
  ostringstream oss;
  string sStack_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  bsim::static_quad_value_bit_vector<41>::binary_string_abi_cxx11_
            (&sStack_1a8,(static_quad_value_bit_vector<41> *)this);
  std::operator<<((ostream *)local_188,(string *)&sStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }